

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float64_unordered_arm(float64 a,float64 b,float_status *status)

{
  int iVar1;
  float64 a_00;
  float64 a_01;
  uint64_t uVar2;
  float_status *status_local;
  float64 b_local;
  float64 a_local;
  
  a_00 = float64_squash_input_denormal_arm(a,status);
  a_01 = float64_squash_input_denormal_arm(b,status);
  iVar1 = extractFloat64Exp(a_00);
  if (iVar1 == 0x7ff) {
    uVar2 = extractFloat64Frac(a_00);
    if (uVar2 == 0) goto LAB_005a21f5;
LAB_005a2214:
    float_raise_arm('\x01',status);
    a_local._4_4_ = 1;
  }
  else {
LAB_005a21f5:
    iVar1 = extractFloat64Exp(a_01);
    if (iVar1 == 0x7ff) {
      uVar2 = extractFloat64Frac(a_01);
      if (uVar2 != 0) goto LAB_005a2214;
    }
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int float64_unordered(float64 a, float64 b, float_status *status)
{
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        float_raise(float_flag_invalid, status);
        return 1;
    }
    return 0;
}